

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<void>_> * __thiscall
Memory::
AllocateArray<Memory::Recycler,JsUtil::SimpleDictionaryEntry<unsigned_int,Memory::WriteBarrierPtr<void>>,false>
          (Memory *this,Recycler *allocator,offset_in_Recycler_to_subr AllocFunc,size_t count)

{
  undefined1 auVar1 [16];
  SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<void>_> *pSVar2;
  ulong uVar3;
  SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<void>_> *pSVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pSVar2 = (SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<void>_> *)0x8;
  }
  else {
    uVar5 = 0;
    pSVar2 = (SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<void>_> *)
             new__<Memory::Recycler>
                       (-(ulong)(count >> 0x3c != 0) | count << 4,(Recycler *)this,
                        (offset_in_Recycler_to_subr)allocator);
    auVar1 = _DAT_00e0c4f0;
    uVar3 = count + 0xfffffffffffffff & 0xfffffffffffffff;
    auVar6._8_4_ = (int)uVar3;
    auVar6._0_8_ = uVar3;
    auVar6._12_4_ = (int)(uVar3 >> 0x20);
    pSVar4 = pSVar2 + 1;
    auVar7 = pmovsxbq(in_XMM1,0x100);
    auVar6 = auVar6 | _DAT_00e0c4f0;
    do {
      if ((bool)(~(auVar6._0_8_ < (long)(uVar5 ^ auVar1._0_8_)) & 1)) {
        pSVar4[-1].
        super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
        .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<void>_>.
        super_ValueEntry<Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<void>_>_>
        .super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<void>_>.value.ptr =
             (void *)0x0;
      }
      auVar8._8_4_ = (int)uVar5;
      auVar8._0_8_ = uVar5;
      auVar8._12_4_ = (int)(uVar5 >> 0x20);
      if ((long)((auVar8._8_8_ | auVar7._8_8_) ^ auVar1._8_8_) <= auVar6._8_8_) {
        (pSVar4->
        super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
        ).super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<void>_>.
        super_ValueEntry<Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<void>_>_>
        .super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<void>_>.value.ptr =
             (void *)0x0;
      }
      uVar5 = uVar5 + 2;
      pSVar4 = pSVar4 + 2;
    } while ((uVar3 - ((uint)(count + 0xfffffffffffffff) & 1)) + 2 != uVar5);
  }
  return pSVar2;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}